

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

char * name(token_type type)

{
  char *pcStack_10;
  token_type type_local;
  
  switch(type) {
  case none:
    pcStack_10 = "nothing";
    break;
  case identifier:
    pcStack_10 = "identifier";
    break;
  case regster:
    pcStack_10 = "register";
    break;
  case predicate:
    pcStack_10 = "predicate";
    break;
  case immediate:
    pcStack_10 = "immediate";
    break;
  case float_immediate:
    pcStack_10 = "floating-point immediate";
    break;
  case plus:
    pcStack_10 = "plus";
    break;
  case minus:
    pcStack_10 = "minus";
    break;
  case tilde:
    pcStack_10 = "tilde";
    break;
  case vbar:
    pcStack_10 = "vertical bar";
    break;
  case bracket_left:
    pcStack_10 = "squared bracket left";
    break;
  case bracket_right:
    pcStack_10 = "squared bracket right";
    break;
  case at:
    pcStack_10 = "at";
    break;
  case semicolon:
    pcStack_10 = "semicolon";
    break;
  case comma:
    pcStack_10 = "comma";
    break;
  default:
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

const char* name(token_type type)
{
    switch (type) {
    default:
        return "unknown";
    case token_type::none:
        return "nothing";
    case token_type::identifier:
        return "identifier";
    case token_type::regster:
        return "register";
    case token_type::predicate:
        return "predicate";
    case token_type::immediate:
        return "immediate";
    case token_type::float_immediate:
        return "floating-point immediate";
    case token_type::plus:
        return "plus";
    case token_type::minus:
        return "minus";
    case token_type::tilde:
        return "tilde";
    case token_type::vbar:
        return "vertical bar";
    case token_type::bracket_left:
        return "squared bracket left";
    case token_type::bracket_right:
        return "squared bracket right";
    case token_type::at:
        return "at";
    case token_type::semicolon:
        return "semicolon";
    case token_type::comma:
        return "comma";
    }
}